

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s3mixw_io.c
# Opt level: O0

int s3mixw_read(char *fn,float32 ****out_mixw,uint32 *out_n_mixw,uint32 *out_n_feat,
               uint32 *out_n_density)

{
  int iVar1;
  int32 iVar2;
  FILE *fp_00;
  char *pcVar3;
  undefined8 in_stack_ffffffffffffff88;
  undefined4 uVar4;
  uint32 *chksum;
  undefined4 uVar5;
  FILE *fp;
  char *do_chk;
  char *ver;
  uint32 ignore;
  uint32 swap;
  uint32 sv_chksum;
  uint32 rd_chksum;
  uint32 *out_n_density_local;
  uint32 *out_n_feat_local;
  uint32 *out_n_mixw_local;
  float32 ****out_mixw_local;
  char *fn_local;
  
  uVar4 = (undefined4)((ulong)in_stack_ffffffffffffff88 >> 0x20);
  swap = 0;
  _sv_chksum = out_n_density;
  out_n_density_local = out_n_feat;
  out_n_feat_local = out_n_mixw;
  out_n_mixw_local = (uint32 *)out_mixw;
  out_mixw_local = (float32 ****)fn;
  fp_00 = s3open(fn,"rb",(uint32 *)((long)&ver + 4));
  if (fp_00 == (FILE *)0x0) {
    fn_local._4_4_ = -1;
  }
  else {
    pcVar3 = s3get_gvn_fattr("version");
    if (pcVar3 == (char *)0x0) {
      err_msg(ERR_FATAL,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3mixw_io.c"
              ,0x51,"No version attribute for %s\n",out_mixw_local);
      exit(1);
    }
    iVar1 = strcmp(pcVar3,"1.0");
    if (iVar1 != 0) {
      err_msg(ERR_FATAL,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3mixw_io.c"
              ,0x4d,"Version mismatch for %s, file ver: %s != reader ver: %s\n",out_mixw_local,
              pcVar3,"1.0");
      exit(1);
    }
    pcVar3 = s3get_gvn_fattr("chksum0");
    chksum = &swap;
    iVar2 = bio_fread_3d((void ****)out_n_mixw_local,4,out_n_feat_local,out_n_density_local,
                         _sv_chksum,fp_00,ver._4_4_,chksum);
    uVar5 = (undefined4)((ulong)chksum >> 0x20);
    if (iVar2 < 0) {
      s3close(fp_00);
      fn_local._4_4_ = -1;
    }
    else {
      if (pcVar3 != (char *)0x0) {
        iVar2 = bio_fread(&ignore,4,1,fp_00,ver._4_4_,(uint32 *)&ver);
        if (iVar2 != 1) {
          s3close(fp_00);
          return -1;
        }
        if (ignore != swap) {
          err_msg(ERR_FATAL,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3mixw_io.c"
                  ,0x6e,"Checksum error; read corrupt data.\n");
          exit(1);
        }
      }
      s3close(fp_00);
      err_msg(ERR_INFO,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3mixw_io.c"
              ,0x75,"Read %s [%ux%ux%u array]\n",out_mixw_local,(ulong)*out_n_feat_local,
              CONCAT44(uVar4,*out_n_density_local),CONCAT44(uVar5,*_sv_chksum));
      fn_local._4_4_ = 0;
    }
  }
  return fn_local._4_4_;
}

Assistant:

int
s3mixw_read(const char *fn,
	    float32 ****out_mixw,
	    uint32 *out_n_mixw,
	    uint32 *out_n_feat,
	    uint32 *out_n_density)
{
    uint32 rd_chksum = 0;
    uint32 sv_chksum;
    uint32 swap;
    uint32 ignore;
    char *ver;
    char *do_chk;
    FILE *fp;

    fp = s3open(fn, "rb", &swap);
    if (fp == NULL)
	return S3_ERROR;

    /* check version id */
    ver = s3get_gvn_fattr("version");
    if (ver) {
	if (strcmp(ver, MIXW_FILE_VERSION) != 0) {
	    E_FATAL("Version mismatch for %s, file ver: %s != reader ver: %s\n",
		    fn, ver, MIXW_FILE_VERSION);
	}
    }
    else {
	E_FATAL("No version attribute for %s\n", fn);
    }
    
    /* if do_chk is non-NULL, there is a checksum after the data in the file */
    do_chk = s3get_gvn_fattr("chksum0");

    /* Read the mixing weight array */
    if (bio_fread_3d((void ****)out_mixw,
		  sizeof(float32),
		  out_n_mixw,
		  out_n_feat,
		  out_n_density,
		  fp,
		  swap,
		  &rd_chksum) < 0) {
	s3close(fp);
	return S3_ERROR;
    }

    if (do_chk) {
	/* See if the checksum in the file matches that which
	   was computed from the read data */

	if (bio_fread(&sv_chksum, sizeof(uint32), 1, fp, swap, &ignore) != 1) {
	    s3close(fp);
	    return S3_ERROR;
	}

	if (sv_chksum != rd_chksum) {
	    E_FATAL("Checksum error; read corrupt data.\n");
	}
    }

    s3close(fp);

    E_INFO("Read %s [%ux%ux%u array]\n",
	   fn, *out_n_mixw, *out_n_feat, *out_n_density);

    return S3_SUCCESS;
}